

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O2

void issue50_off_fastpath(void)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  _Alloc_hider _Var9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ostream *poVar14;
  runtime_error *this;
  byte bVar15;
  byte bVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  byte bVar21;
  int iVar22;
  byte *pbVar23;
  long lVar24;
  byte *pbVar25;
  byte *pbVar26;
  bool bVar27;
  double dVar28;
  double local_50;
  string a;
  
  std::__cxx11::string::string((string *)&a,"-0.0e-22",(allocator *)&local_50);
  bVar1 = *a._M_dataplus._M_p;
  _Var9 = a._M_dataplus;
  bVar15 = bVar1;
  if (bVar1 == 0x2d) {
    bVar15 = a._M_dataplus._M_p[1];
    if ((byte)(bVar15 - 0x30) < 10) {
      _Var9._M_p = a._M_dataplus._M_p + 1;
      goto LAB_001046de;
    }
  }
  else {
LAB_001046de:
    if (bVar15 == 0x30) {
      bVar21 = ((byte *)_Var9._M_p)[1];
      if (9 < (byte)(bVar21 - 0x30)) {
        pbVar25 = (byte *)_Var9._M_p + 1;
        uVar20 = 0;
LAB_001046fa:
        if (bVar21 == 0x2e) {
          bVar16 = pbVar25[1] - 0x30;
          if (9 < bVar16) goto LAB_00104aa9;
          pbVar23 = pbVar25 + 1;
          lVar19 = 0;
          pbVar25 = pbVar23;
          do {
            uVar20 = (ulong)bVar16 + uVar20 * 10;
            bVar21 = pbVar25[1];
            pbVar25 = pbVar25 + 1;
            bVar16 = bVar21 - 0x30;
            lVar19 = lVar19 + -1;
          } while (bVar16 < 10);
          iVar22 = (int)pbVar23 - (int)lVar19;
        }
        else {
          lVar19 = 0;
          iVar22 = (int)pbVar25;
        }
        if ((bVar21 | 0x20) == 0x65) {
          bVar27 = (pbVar25[1] - 0x2b & 0xfd) == 0;
          pbVar23 = pbVar25 + 1;
          if (bVar27) {
            pbVar23 = pbVar25 + 2;
          }
          bVar21 = pbVar25[(ulong)bVar27 + 1] - 0x30;
          if (9 < bVar21) goto LAB_00104aa9;
          bVar16 = pbVar23[1] - 0x30;
          uVar13 = (ulong)bVar21 * 10 + (ulong)bVar16;
          if (9 < bVar16) {
            uVar13 = (ulong)bVar21;
          }
          pbVar26 = pbVar23 + 2;
          if (9 < bVar16) {
            pbVar26 = pbVar23 + 1;
          }
          bVar21 = pbVar23[(ulong)(bVar16 < 10) + 1] - 0x30;
          pbVar26 = pbVar26 + (bVar21 < 10);
          uVar12 = (ulong)bVar21 + uVar13 * 10;
          if (9 < bVar21) {
            uVar12 = uVar13;
          }
          for (; (byte)(*pbVar26 - 0x30) < 10; pbVar26 = pbVar26 + 1) {
            if ((long)uVar12 < 0x100000000) {
              uVar12 = (ulong)(byte)(*pbVar26 - 0x30) + uVar12 * 10;
            }
          }
          uVar13 = -uVar12;
          if (pbVar25[1] != 0x2d) {
            uVar13 = uVar12;
          }
          lVar19 = lVar19 + uVar13;
        }
        if ((int)(~(uint)_Var9._M_p + iVar22) < 0x13) {
LAB_00104867:
          if (lVar19 - 0x135U < 0xfffffffffffffd86) goto LAB_00104876;
          if ((uVar20 >> 0x35 == 0) && (lVar19 + 0x16U < 0x2d)) {
            if (lVar19 < 0) {
              dVar28 = (double)(long)uVar20 /
                       *(double *)
                        (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                         power_of_ten + lVar19 * -8);
            }
            else {
              dVar28 = (double)(long)uVar20 *
                       *(double *)
                        (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                         power_of_ten + lVar19 * 8);
            }
            if (bVar1 == 0x2d) {
              dVar28 = -dVar28;
            }
          }
          else {
            if (uVar20 != 0) {
              uVar13 = 0x3f;
              if (uVar20 != 0) {
                for (; uVar20 >> uVar13 == 0; uVar13 = uVar13 - 1) {
                }
              }
              uVar20 = uVar20 << ((byte)(uVar13 ^ 0x3f) & 0x3f);
              auVar2._8_8_ = 0;
              auVar2._0_8_ = uVar20;
              auVar4._8_8_ = 0;
              auVar4._0_8_ = *(ulong *)(fast_double_parser::
                                        compute_float_64(long,unsigned_long,bool,bool*)::mantissa_64
                                       + lVar19 * 8 + 0xa28);
              auVar2 = auVar2 * auVar4;
              uVar11 = auVar2._0_8_;
              uVar12 = auVar2._8_8_ & 0x1ff;
              if ((uVar12 == 0x1ff) && (uVar12 = 0x1ff, CARRY8(uVar11,uVar20))) {
                auVar3._8_8_ = 0;
                auVar3._0_8_ = uVar20;
                auVar5._8_8_ = 0;
                auVar5._0_8_ = *(ulong *)(fast_double_parser::
                                          compute_float_64(long,unsigned_long,bool,bool*)::
                                          mantissa_128 + lVar19 * 8 + 0xa28);
                uVar18 = SUB168(auVar3 * auVar5,8);
                auVar8._8_8_ = 0;
                auVar8._0_8_ = uVar18;
                auVar6._8_8_ = 0;
                auVar6._0_8_ = uVar18;
                auVar7._8_8_ = 0;
                auVar7._0_8_ = uVar18;
                auVar7 = auVar2 + auVar7;
                auVar6 = auVar2 + auVar6;
                uVar17 = auVar2._8_4_ + (uint)CARRY8(uVar11,uVar18) & 0x1ff;
                uVar12 = (ulong)uVar17;
                auVar2 = auVar2 + auVar8;
                if ((!CARRY8(SUB168(auVar3 * auVar5,0),uVar20)) ||
                   ((auVar2 = auVar6, uVar11 + uVar18 != -1 || (auVar2 = auVar7, uVar17 != 0x1ff))))
                goto LAB_0010490b;
              }
              else {
LAB_0010490b:
                uVar20 = auVar2._8_8_ >> (9U - (auVar2[0xf] >> 7) & 0x3f);
                uVar17 = (uint)uVar20;
                if ((auVar2._0_8_ != 0) || ((uVar12 != 0 || ((uVar17 & 3) != 1)))) {
                  uVar20 = (uVar17 & 1) + uVar20;
                  uVar12 = uVar20 >> 0x36;
                  uVar13 = ((lVar19 * 0x3526a >> 0x10) + 0x43f) -
                           ((auVar2._8_8_ >> 0x3f ^ 1) + (uVar13 ^ 0x3f) + -1 + (ulong)(uVar12 == 0)
                           );
                  if ((uVar13 != 0) && (uVar13 < 0x7ff)) {
                    uVar11 = 0;
                    if (uVar12 == 0) {
                      uVar11 = uVar20 >> 1 & 0xefffffffffffff;
                    }
                    dVar28 = (double)((ulong)(bVar1 == 0x2d) << 0x3f | uVar11 | uVar13 << 0x34);
                    goto LAB_001049e9;
                  }
                }
              }
              local_50 = 0.0;
              goto LAB_00104876;
            }
            if (bVar1 == 0x2d) {
              dVar28 = -0.0;
            }
            else {
              dVar28 = 0.0;
            }
          }
        }
        else {
          lVar24 = 1;
          while ((bVar15 == 0x30 || (bVar15 == 0x2e))) {
            pbVar25 = (byte *)_Var9._M_p + lVar24;
            lVar24 = lVar24 + 1;
            bVar15 = *pbVar25;
          }
          if ((int)((iVar22 - (uint)_Var9._M_p) - (int)lVar24) < 0x13) goto LAB_00104867;
LAB_00104876:
          pcVar10 = fast_double_parser::parse_float_strtod(a._M_dataplus._M_p,&local_50);
          dVar28 = local_50;
          if (pcVar10 == (char *)0x0) goto LAB_00104aa9;
        }
LAB_001049e9:
        if ((long)dVar28 < 0) {
          poVar14 = std::operator<<((ostream *)&std::cout,"-0.0-22 signbit is negative");
          std::endl<char,std::char_traits<char>>(poVar14);
          std::__cxx11::string::~string((string *)&a);
          return;
        }
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"-0.0-22 signbit is positive");
        goto LAB_00104adf;
      }
    }
    else if ((byte)(bVar15 - 0x30) < 10) {
      uVar20 = (ulong)(byte)(bVar15 - 0x30);
      pbVar25 = (byte *)_Var9._M_p;
      while( true ) {
        pbVar25 = pbVar25 + 1;
        bVar21 = *pbVar25;
        if (9 < (byte)(bVar21 - 0x30)) break;
        uVar20 = (ulong)(byte)(bVar21 - 0x30) + uVar20 * 10;
      }
      goto LAB_001046fa;
    }
  }
LAB_00104aa9:
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"could not parse -0.0-22");
LAB_00104adf:
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void issue50_off_fastpath() {
  std::string a = "-0.0e-22";
  double x;
  bool ok = fast_double_parser::parse_number(a.c_str(), &x);
  if(!ok) throw std::runtime_error("could not parse -0.0-22");
  if(!std::signbit(x)) throw std::runtime_error("-0.0-22 signbit is positive");
  std::cout << "-0.0-22 signbit is negative" << std::endl;
}